

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  StreamingConcatenationExpressionSyntax *pSVar1;
  Token *unaff_retaddr;
  ExpressionSyntax **in_stack_00000008;
  Token *in_stack_00000010;
  Token *in_stack_00000018;
  BumpAllocator *in_stack_00000020;
  Token *in_stack_00000040;
  Token *in_stack_00000048;
  BumpAllocator *in_stack_000000b8;
  SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *in_stack_000000c0;
  BumpAllocator *in_stack_ffffffffffffff68;
  ExpressionSyntax *in_stack_ffffffffffffff70;
  
  parsing::Token::deepClone((Token *)in_stack_000000c0,in_stack_000000b8);
  parsing::Token::deepClone((Token *)in_stack_000000c0,in_stack_000000b8);
  if ((((SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *)((long)__fn + 0x38))->
      super_SyntaxListBase)._vptr_SyntaxListBase != (_func_int **)0x0) {
    deepClone<slang::syntax::ExpressionSyntax>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  parsing::Token::deepClone((Token *)in_stack_000000c0,in_stack_000000b8);
  deepClone<slang::syntax::StreamExpressionSyntax>(in_stack_000000c0,in_stack_000000b8);
  parsing::Token::deepClone((Token *)in_stack_000000c0,in_stack_000000b8);
  parsing::Token::deepClone((Token *)in_stack_000000c0,in_stack_000000b8);
  pSVar1 = BumpAllocator::
           emplace<slang::syntax::StreamingConcatenationExpressionSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax*,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>&,slang::parsing::Token,slang::parsing::Token>
                     (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                      unaff_retaddr,
                      (SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *)__fn,
                      in_stack_00000040,in_stack_00000048);
  return (int)pSVar1;
}

Assistant:

static SyntaxNode* clone(const StreamingConcatenationExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<StreamingConcatenationExpressionSyntax>(
        node.openBrace.deepClone(alloc),
        node.operatorToken.deepClone(alloc),
        node.sliceSize ? deepClone(*node.sliceSize, alloc) : nullptr,
        node.innerOpenBrace.deepClone(alloc),
        *deepClone(node.expressions, alloc),
        node.innerCloseBrace.deepClone(alloc),
        node.closeBrace.deepClone(alloc)
    );
}